

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

void __thiscall
Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
          (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,
          MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *factors)

{
  ulong uVar1;
  __mpz_struct local_50;
  uint local_40 [2];
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_38;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_30;
  
  IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_50,1);
  local_30._factors._capacity = (factors->_factors)._capacity;
  (factors->_factors)._capacity = 0;
  local_30._factors._end = (factors->_factors)._end;
  local_30._factors._stack = (factors->_factors)._stack;
  local_30._factors._cursor = (factors->_factors)._cursor;
  (factors->_factors)._cursor = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  (factors->_factors)._end = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  (factors->_factors)._stack = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)local_40,&local_30);
  IntegerConstantType::IntegerConstantType(&this->numeral,(IntegerConstantType *)&local_50);
  (this->factors)._id = local_40[0];
  (this->factors)._ptr = local_38;
  if (local_30._factors._stack !=
      (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar1 = local_30._factors._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)
       &((local_30._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_30._factors._stack;
    }
    else if (uVar1 < 0x11) {
      *(undefined8 *)
       &((local_30._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_30._factors._stack;
    }
    else if (uVar1 < 0x19) {
      *(undefined8 *)
       &((local_30._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_30._factors._stack;
    }
    else if (uVar1 < 0x21) {
      *(undefined8 *)
       &((local_30._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_30._factors._stack;
    }
    else if (uVar1 < 0x31) {
      *(undefined8 *)
       &((local_30._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_30._factors._stack;
    }
    else if (uVar1 < 0x41) {
      *(undefined8 *)
       &((local_30._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_30._factors._stack;
    }
    else {
      operator_delete(local_30._factors._stack,0x10);
    }
  }
  mpz_clear(&local_50);
  return;
}

Assistant:

Monom(MonomFactors<Number> factors) : Monom(Numeral(1), perfect(std::move(factors))) {}